

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void aom_lowbd_blend_a64_d16_mask_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params)

{
  ulong uVar1;
  undefined8 uVar2;
  short sVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  CONV_BUF_TYPE *pCVar7;
  uint shift;
  int iVar8;
  int j_3;
  uint8_t *puVar9;
  CONV_BUF_TYPE *pCVar10;
  int j;
  long lVar11;
  bool bVar12;
  __m128i alVar13;
  __m128i extraout_XMM0;
  undefined1 auVar14 [16];
  uint3 uVar15;
  __m128i in_XMM1;
  undefined1 auVar18 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  short sVar41;
  short sVar42;
  short sVar43;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 (*local_d0) [16];
  uint8_t *local_c8;
  CONV_BUF_TYPE *local_c0;
  __m128i m0;
  __m128i v_maxval;
  __m128i v_round_offset;
  undefined1 local_48 [2];
  ushort uStack_46;
  ushort uStack_44;
  ushort uStack_42;
  ushort uStack_40;
  ushort uStack_3e;
  ushort uStack_3c;
  ushort uStack_3a;
  uint5 uVar16;
  uint7 uVar17;
  undefined1 auVar22 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  
  auVar14 = _DAT_0042a5f0;
  uVar4 = (ulong)src0_stride;
  iVar6 = conv_params->round_1 + conv_params->round_0;
  cVar5 = (char)iVar6;
  iVar8 = (-1 << (0xdU - cVar5 & 0x1f)) +
          (1 << (0x15U - cVar5 & 0x1f)) + (1 << (0x16U - cVar5 & 0x1f));
  shift = 0x14 - iVar6;
  local_d0 = (undefined1 (*) [16])mask;
  v_round_offset[0]._0_4_ = iVar8 * 0x40;
  v_round_offset[0]._4_4_ = iVar8 * 0x40;
  v_round_offset[1]._0_4_ = iVar8 * 0x40;
  v_round_offset[1]._4_4_ = iVar8 * 0x40;
  local_c8 = dst;
  if (subh == 0 && subw == 0) {
    if (w == 8) {
      alVar13 = (__m128i)pmovsxbw((undefined1  [16])v_round_offset,0x4040404040404040);
      iVar6 = 0;
      v_maxval = alVar13;
      if (0 < h) {
        iVar6 = h;
      }
      while (iVar6 != 0) {
        m0 = (__m128i)pmovzxbw((undefined1  [16])alVar13,*(undefined8 *)*local_d0);
        blend_a64_d16_mask_w8_sse41(local_c8,src0,src1,&m0,&v_round_offset,&v_maxval,shift);
        local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride);
        local_c8 = local_c8 + dst_stride;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar4;
        alVar13 = extraout_XMM0;
        iVar6 = iVar6 + -1;
      }
    }
    else if (w == 4) {
      iVar6 = 0;
      if (0 < h) {
        iVar6 = h;
      }
      auVar14 = pmovsxbw((undefined1  [16])in_XMM1,0x4040404040404040);
      auVar19 = ZEXT416(shift);
      while (bVar12 = iVar6 != 0, iVar6 = iVar6 + -1, bVar12) {
        auVar20 = pmovzxbw(ZEXT416(*(uint *)*local_d0),ZEXT416(*(uint *)*local_d0));
        auVar21._0_2_ = auVar20._0_2_;
        uVar1 = *(ulong *)src0;
        uVar2 = *(undefined8 *)src1;
        auVar35._8_4_ = 0;
        auVar35._0_8_ = uVar1;
        auVar35._12_2_ = (short)(uVar1 >> 0x30);
        auVar35._14_2_ = (short)((ulong)uVar2 >> 0x30);
        auVar34._12_4_ = auVar35._12_4_;
        auVar34._8_2_ = 0;
        auVar34._0_8_ = uVar1;
        auVar34._10_2_ = (short)((ulong)uVar2 >> 0x20);
        auVar33._10_6_ = auVar34._10_6_;
        auVar33._8_2_ = (short)(uVar1 >> 0x20);
        auVar33._0_8_ = uVar1;
        auVar32._8_8_ = auVar33._8_8_;
        auVar32._6_2_ = (short)((ulong)uVar2 >> 0x10);
        auVar32._4_2_ = (short)(uVar1 >> 0x10);
        auVar32._0_2_ = (undefined2)uVar1;
        auVar32._2_2_ = (short)uVar2;
        auVar24._0_12_ = auVar20._0_12_;
        auVar24._12_2_ = auVar20._6_2_;
        auVar24._14_2_ = auVar14._6_2_ - auVar20._6_2_;
        auVar45._12_4_ = auVar24._12_4_;
        auVar45._0_10_ = auVar20._0_10_;
        auVar45._10_2_ = auVar14._4_2_ - auVar20._4_2_;
        auVar22._10_6_ = auVar45._10_6_;
        auVar22._0_8_ = auVar20._0_8_;
        auVar22._8_2_ = auVar20._4_2_;
        auVar21._8_8_ = auVar22._8_8_;
        auVar21._6_2_ = auVar14._2_2_ - auVar20._2_2_;
        auVar21._4_2_ = auVar20._2_2_;
        auVar21._2_2_ = auVar14._0_2_ - auVar21._0_2_;
        auVar20 = pmaddwd(auVar21,auVar32);
        auVar23._0_4_ = auVar20._0_4_ + iVar8 * -0x40 >> auVar19;
        auVar23._4_4_ = auVar20._4_4_ + iVar8 * -0x40 >> auVar19;
        auVar23._8_4_ = auVar20._8_4_ + iVar8 * -0x40 >> auVar19;
        auVar23._12_4_ = auVar20._12_4_ + iVar8 * -0x40 >> auVar19;
        auVar20 = packssdw(auVar23,auVar23);
        sVar41 = auVar20._0_2_;
        sVar42 = auVar20._2_2_;
        sVar43 = auVar20._4_2_;
        sVar3 = auVar20._6_2_;
        *(uint *)local_c8 =
             CONCAT13((0 < sVar3) * (sVar3 < 0x100) * auVar20[6] - (0xff < sVar3),
                      CONCAT12((0 < sVar43) * (sVar43 < 0x100) * auVar20[4] - (0xff < sVar43),
                               CONCAT11((0 < sVar42) * (sVar42 < 0x100) * auVar20[2] -
                                        (0xff < sVar42),
                                        (0 < sVar41) * (sVar41 < 0x100) * auVar20[0] -
                                        (0xff < sVar41))));
        local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride);
        local_c8 = local_c8 + dst_stride;
        src1 = src1 + src1_stride;
        src0 = (CONV_BUF_TYPE *)((long)src0 + uVar4 * 2);
      }
    }
    else {
      v_maxval = (__m128i)pmovsxbw((undefined1  [16])v_round_offset,0x4040404040404040);
      iVar6 = 0;
      if (h < 1) {
        h = iVar6;
      }
      for (; iVar6 != h; iVar6 = iVar6 + 1) {
        pCVar7 = src0;
        pCVar10 = src1;
        for (lVar11 = 0; lVar11 < w; lVar11 = lVar11 + 0x10) {
          auVar14 = *(undefined1 (*) [16])(*local_d0 + lVar11);
          in_XMM1 = (__m128i)pmovzxbw((undefined1  [16])in_XMM1,auVar14);
          local_48 = (undefined1  [2])CONCAT11(0,auVar14[8]);
          _local_48 = (uint)CONCAT12(auVar14[9],local_48);
          _local_48 = (uint6)CONCAT14(auVar14[10],_local_48);
          _local_48 = (ulong)CONCAT16(auVar14[0xb],_local_48);
          uStack_40._0_1_ = auVar14[0xc];
          uStack_40._1_1_ = 0;
          uStack_3e._0_1_ = auVar14[0xd];
          uStack_3e._1_1_ = 0;
          uStack_3c._0_1_ = auVar14[0xe];
          uStack_3c._1_1_ = 0;
          uStack_3a._0_1_ = auVar14[0xf];
          uStack_3a._1_1_ = 0;
          m0 = in_XMM1;
          blend_a64_d16_mask_w16_sse41
                    (local_c8 + lVar11,pCVar7,pCVar10,&m0,(__m128i *)local_48,&v_round_offset,
                     &v_maxval,shift);
          pCVar10 = pCVar10 + 0x10;
          pCVar7 = pCVar7 + 0x10;
        }
        local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride);
        local_c8 = local_c8 + dst_stride;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar4;
      }
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    if (w == 8) {
      v_maxval = (__m128i)pmovsxbw((undefined1  [16])v_round_offset,0x4040404040404040);
      iVar6 = 0;
      if (0 < h) {
        iVar6 = h;
      }
      while (iVar6 != 0) {
        auVar14 = paddusb(*(undefined1 (*) [16])(*local_d0 + mask_stride),*local_d0);
        auVar14 = pmaddubsw(auVar14,_DAT_0042a5f0);
        m0[0]._2_2_ = (ushort)(auVar14._2_2_ + 2U) >> 2;
        m0[0]._0_2_ = (ushort)(auVar14._0_2_ + 2U) >> 2;
        m0[0]._4_2_ = (ushort)(auVar14._4_2_ + 2U) >> 2;
        m0[0]._6_2_ = (ushort)(auVar14._6_2_ + 2U) >> 2;
        m0[1]._0_2_ = (ushort)(auVar14._8_2_ + 2U) >> 2;
        m0[1]._2_2_ = (ushort)(auVar14._10_2_ + 2U) >> 2;
        m0[1]._4_2_ = (ushort)(auVar14._12_2_ + 2U) >> 2;
        m0[1]._6_2_ = (ushort)(auVar14._14_2_ + 2U) >> 2;
        blend_a64_d16_mask_w8_sse41(local_c8,src0,src1,&m0,&v_round_offset,&v_maxval,shift);
        local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride * 2);
        local_c8 = local_c8 + dst_stride;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar4;
        iVar6 = iVar6 + -1;
      }
    }
    else if (w == 4) {
      iVar6 = 0;
      if (0 < h) {
        iVar6 = h;
      }
      auVar19 = pmovsxbw(in_XMM2,0x202020202020202);
      auVar20 = pmovsxbw(in_XMM3,0x4040404040404040);
      auVar24 = ZEXT416(shift);
      while (bVar12 = iVar6 != 0, iVar6 = iVar6 + -1, bVar12) {
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)*local_d0;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)(*local_d0 + mask_stride);
        auVar45 = paddusb(auVar44,auVar31);
        auVar45 = pmaddubsw(auVar45,auVar14);
        auVar46._0_2_ = (ushort)(auVar45._0_2_ + auVar19._0_2_) >> 2;
        uVar52 = (ushort)(auVar45._2_2_ + auVar19._2_2_) >> 2;
        uVar53 = (ushort)(auVar45._4_2_ + auVar19._4_2_) >> 2;
        uVar54 = (ushort)(auVar45._6_2_ + auVar19._6_2_) >> 2;
        uVar1 = *(ulong *)src0;
        uVar2 = *(undefined8 *)src1;
        auVar58._8_4_ = 0;
        auVar58._0_8_ = uVar1;
        auVar58._12_2_ = (short)(uVar1 >> 0x30);
        auVar58._14_2_ = (short)((ulong)uVar2 >> 0x30);
        auVar57._12_4_ = auVar58._12_4_;
        auVar57._8_2_ = 0;
        auVar57._0_8_ = uVar1;
        auVar57._10_2_ = (short)((ulong)uVar2 >> 0x20);
        auVar56._10_6_ = auVar57._10_6_;
        auVar56._8_2_ = (short)(uVar1 >> 0x20);
        auVar56._0_8_ = uVar1;
        auVar55._8_8_ = auVar56._8_8_;
        auVar55._6_2_ = (short)((ulong)uVar2 >> 0x10);
        auVar55._4_2_ = (short)(uVar1 >> 0x10);
        auVar55._0_2_ = (undefined2)uVar1;
        auVar55._2_2_ = (short)uVar2;
        auVar46._8_8_ =
             (undefined8)
             (CONCAT64(CONCAT42(CONCAT22(auVar20._6_2_ - uVar54,uVar54),auVar20._4_2_ - uVar53),
                       CONCAT22(uVar53,uVar54)) >> 0x10);
        auVar46._6_2_ = auVar20._2_2_ - uVar52;
        auVar46._4_2_ = uVar52;
        auVar46._2_2_ = auVar20._0_2_ - auVar46._0_2_;
        auVar45 = pmaddwd(auVar46,auVar55);
        auVar47._0_4_ = auVar45._0_4_ + iVar8 * -0x40 >> auVar24;
        auVar47._4_4_ = auVar45._4_4_ + iVar8 * -0x40 >> auVar24;
        auVar47._8_4_ = auVar45._8_4_ + iVar8 * -0x40 >> auVar24;
        auVar47._12_4_ = auVar45._12_4_ + iVar8 * -0x40 >> auVar24;
        auVar45 = packssdw(auVar47,auVar47);
        sVar41 = auVar45._0_2_;
        sVar42 = auVar45._2_2_;
        sVar43 = auVar45._4_2_;
        sVar3 = auVar45._6_2_;
        *(uint *)local_c8 =
             CONCAT13((0 < sVar3) * (sVar3 < 0x100) * auVar45[6] - (0xff < sVar3),
                      CONCAT12((0 < sVar43) * (sVar43 < 0x100) * auVar45[4] - (0xff < sVar43),
                               CONCAT11((0 < sVar42) * (sVar42 < 0x100) * auVar45[2] -
                                        (0xff < sVar42),
                                        (0 < sVar41) * (sVar41 < 0x100) * auVar45[0] -
                                        (0xff < sVar41))));
        local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride * 2);
        local_c8 = local_c8 + dst_stride;
        src1 = src1 + src1_stride;
        src0 = (CONV_BUF_TYPE *)((long)src0 + uVar4 * 2);
      }
    }
    else {
      v_maxval = (__m128i)pmovsxbw((undefined1  [16])v_round_offset,0x4040404040404040);
      iVar6 = 0;
      if (h < 1) {
        h = 0;
      }
      puVar9 = mask + (ulong)mask_stride + 0x10;
      local_c0 = src1;
      for (; iVar6 != h; iVar6 = iVar6 + 1) {
        pCVar7 = local_c0;
        pCVar10 = src0;
        for (lVar11 = 0; lVar11 < w; lVar11 = lVar11 + 0x10) {
          auVar19 = paddusb(*(undefined1 (*) [16])(puVar9 + lVar11 * 2 + -0x10),
                            *(undefined1 (*) [16])(*local_d0 + lVar11 * 2));
          auVar14 = paddusb(*(undefined1 (*) [16])(puVar9 + lVar11 * 2),
                            *(undefined1 (*) [16])(local_d0[1] + lVar11 * 2));
          auVar20 = pmaddubsw(auVar19,_DAT_0042a5f0);
          auVar14 = pmaddubsw(auVar14,_DAT_0042a5f0);
          auVar19 = pmovsxbw(_DAT_0042a5f0,0x202020202020202);
          m0[0]._2_2_ = (ushort)(auVar20._2_2_ + auVar19._2_2_) >> 2;
          m0[0]._0_2_ = (ushort)(auVar20._0_2_ + auVar19._0_2_) >> 2;
          m0[0]._4_2_ = (ushort)(auVar20._4_2_ + auVar19._4_2_) >> 2;
          m0[0]._6_2_ = (ushort)(auVar20._6_2_ + auVar19._6_2_) >> 2;
          m0[1]._0_2_ = (ushort)(auVar20._8_2_ + auVar19._8_2_) >> 2;
          m0[1]._2_2_ = (ushort)(auVar20._10_2_ + auVar19._10_2_) >> 2;
          m0[1]._4_2_ = (ushort)(auVar20._12_2_ + auVar19._12_2_) >> 2;
          m0[1]._6_2_ = (ushort)(auVar20._14_2_ + auVar19._14_2_) >> 2;
          uStack_46 = (ushort)(auVar14._2_2_ + auVar19._2_2_) >> 2;
          local_48 = (undefined1  [2])((ushort)(auVar14._0_2_ + auVar19._0_2_) >> 2);
          uStack_44 = (ushort)(auVar14._4_2_ + auVar19._4_2_) >> 2;
          uStack_42 = (ushort)(auVar14._6_2_ + auVar19._6_2_) >> 2;
          uStack_40 = (ushort)(auVar14._8_2_ + auVar19._8_2_) >> 2;
          uStack_3e = (ushort)(auVar14._10_2_ + auVar19._10_2_) >> 2;
          uStack_3c = (ushort)(auVar14._12_2_ + auVar19._12_2_) >> 2;
          uStack_3a = (ushort)(auVar14._14_2_ + auVar19._14_2_) >> 2;
          blend_a64_d16_mask_w16_sse41
                    (local_c8 + lVar11,pCVar10,pCVar7,&m0,(__m128i *)local_48,&v_round_offset,
                     &v_maxval,shift);
          pCVar7 = pCVar7 + 0x10;
          pCVar10 = pCVar10 + 0x10;
        }
        local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride * 2);
        local_c8 = local_c8 + dst_stride;
        local_c0 = local_c0 + src1_stride;
        src0 = src0 + uVar4;
        puVar9 = puVar9 + mask_stride * 2;
      }
    }
  }
  else if ((subw ^ 1U) == 0 && subh == 0) {
    if (w == 8) {
      v_maxval = (__m128i)pmovsxbw((undefined1  [16])v_round_offset,0x4040404040404040);
      iVar6 = 0;
      if (0 < h) {
        iVar6 = h;
      }
      while (iVar6 != 0) {
        auVar14 = pmaddubsw(*local_d0,_DAT_0042a5f0);
        m0[0]._0_2_ = pavgw(auVar14._0_2_,0);
        m0[0]._2_2_ = pavgw(auVar14._2_2_,0);
        m0[0]._4_2_ = pavgw(auVar14._4_2_,0);
        m0[0]._6_2_ = pavgw(auVar14._6_2_,0);
        m0[1]._0_2_ = pavgw(auVar14._8_2_,0);
        m0[1]._2_2_ = pavgw(auVar14._10_2_,0);
        m0[1]._4_2_ = pavgw(auVar14._12_2_,0);
        m0[1]._6_2_ = pavgw(auVar14._14_2_,0);
        blend_a64_d16_mask_w8_sse41(local_c8,src0,src1,&m0,&v_round_offset,&v_maxval,shift);
        local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride);
        local_c8 = local_c8 + dst_stride;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar4;
        iVar6 = iVar6 + -1;
      }
    }
    else if (w == 4) {
      iVar6 = 0;
      if (0 < h) {
        iVar6 = h;
      }
      auVar19 = pmovsxbw(in_XMM3,0x4040404040404040);
      auVar20 = ZEXT416(shift);
      while (bVar12 = iVar6 != 0, iVar6 = iVar6 + -1, bVar12) {
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)*local_d0;
        auVar24 = pmaddubsw(auVar36,auVar14);
        auVar37._0_2_ = pavgw(auVar24._0_2_,0);
        sVar41 = pavgw(auVar24._2_2_,0);
        sVar42 = pavgw(auVar24._4_2_,0);
        sVar43 = pavgw(auVar24._6_2_,0);
        pavgw(auVar24._8_2_,0);
        pavgw(auVar24._10_2_,0);
        pavgw(auVar24._12_2_,0);
        pavgw(auVar24._14_2_,0);
        uVar1 = *(ulong *)src0;
        uVar2 = *(undefined8 *)src1;
        auVar62._8_4_ = 0;
        auVar62._0_8_ = uVar1;
        auVar62._12_2_ = (short)(uVar1 >> 0x30);
        auVar62._14_2_ = (short)((ulong)uVar2 >> 0x30);
        auVar61._12_4_ = auVar62._12_4_;
        auVar61._8_2_ = 0;
        auVar61._0_8_ = uVar1;
        auVar61._10_2_ = (short)((ulong)uVar2 >> 0x20);
        auVar60._10_6_ = auVar61._10_6_;
        auVar60._8_2_ = (short)(uVar1 >> 0x20);
        auVar60._0_8_ = uVar1;
        auVar59._8_8_ = auVar60._8_8_;
        auVar59._6_2_ = (short)((ulong)uVar2 >> 0x10);
        auVar59._4_2_ = (short)(uVar1 >> 0x10);
        auVar59._0_2_ = (undefined2)uVar1;
        auVar59._2_2_ = (short)uVar2;
        auVar37._8_8_ =
             (undefined8)
             (CONCAT64(CONCAT42(CONCAT22(auVar19._6_2_ - sVar43,sVar43),auVar19._4_2_ - sVar42),
                       CONCAT22(sVar42,sVar43)) >> 0x10);
        auVar37._6_2_ = auVar19._2_2_ - sVar41;
        auVar37._4_2_ = sVar41;
        auVar37._2_2_ = auVar19._0_2_ - auVar37._0_2_;
        auVar24 = pmaddwd(auVar37,auVar59);
        auVar38._0_4_ = auVar24._0_4_ + iVar8 * -0x40 >> auVar20;
        auVar38._4_4_ = auVar24._4_4_ + iVar8 * -0x40 >> auVar20;
        auVar38._8_4_ = auVar24._8_4_ + iVar8 * -0x40 >> auVar20;
        auVar38._12_4_ = auVar24._12_4_ + iVar8 * -0x40 >> auVar20;
        auVar24 = packssdw(auVar38,auVar38);
        sVar41 = auVar24._0_2_;
        sVar42 = auVar24._2_2_;
        sVar43 = auVar24._4_2_;
        sVar3 = auVar24._6_2_;
        *(uint *)local_c8 =
             CONCAT13((0 < sVar3) * (sVar3 < 0x100) * auVar24[6] - (0xff < sVar3),
                      CONCAT12((0 < sVar43) * (sVar43 < 0x100) * auVar24[4] - (0xff < sVar43),
                               CONCAT11((0 < sVar42) * (sVar42 < 0x100) * auVar24[2] -
                                        (0xff < sVar42),
                                        (0 < sVar41) * (sVar41 < 0x100) * auVar24[0] -
                                        (0xff < sVar41))));
        local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride);
        local_c8 = local_c8 + dst_stride;
        src1 = src1 + src1_stride;
        src0 = (CONV_BUF_TYPE *)((long)src0 + uVar4 * 2);
      }
    }
    else {
      v_maxval = (__m128i)pmovsxbw((undefined1  [16])v_round_offset,0x4040404040404040);
      iVar6 = 0;
      if (h < 1) {
        h = 0;
      }
      for (; iVar6 != h; iVar6 = iVar6 + 1) {
        pCVar7 = src0;
        pCVar10 = src1;
        for (lVar11 = 0; lVar11 < w; lVar11 = lVar11 + 0x10) {
          auVar14 = pmaddubsw(*(undefined1 (*) [16])(*local_d0 + lVar11 * 2),_DAT_0042a5f0);
          auVar19 = pmaddubsw(*(undefined1 (*) [16])(local_d0[1] + lVar11 * 2),_DAT_0042a5f0);
          m0[0]._0_2_ = pavgw(auVar14._0_2_,0);
          m0[0]._2_2_ = pavgw(auVar14._2_2_,0);
          m0[0]._4_2_ = pavgw(auVar14._4_2_,0);
          m0[0]._6_2_ = pavgw(auVar14._6_2_,0);
          m0[1]._0_2_ = pavgw(auVar14._8_2_,0);
          m0[1]._2_2_ = pavgw(auVar14._10_2_,0);
          m0[1]._4_2_ = pavgw(auVar14._12_2_,0);
          m0[1]._6_2_ = pavgw(auVar14._14_2_,0);
          local_48 = (undefined1  [2])pavgw(auVar19._0_2_,0);
          uStack_46 = pavgw(auVar19._2_2_,0);
          uStack_44 = pavgw(auVar19._4_2_,0);
          uStack_42 = pavgw(auVar19._6_2_,0);
          uStack_40 = pavgw(auVar19._8_2_,0);
          uStack_3e = pavgw(auVar19._10_2_,0);
          uStack_3c = pavgw(auVar19._12_2_,0);
          uStack_3a = pavgw(auVar19._14_2_,0);
          blend_a64_d16_mask_w16_sse41
                    (local_c8 + lVar11,pCVar7,pCVar10,&m0,(__m128i *)local_48,&v_round_offset,
                     &v_maxval,shift);
          pCVar10 = pCVar10 + 0x10;
          pCVar7 = pCVar7 + 0x10;
        }
        local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride);
        local_c8 = local_c8 + dst_stride;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar4;
      }
    }
  }
  else if (w == 8) {
    v_maxval = (__m128i)pmovsxbw((undefined1  [16])v_round_offset,0x4040404040404040);
    iVar6 = 0;
    if (0 < h) {
      iVar6 = h;
    }
    while (iVar6 != 0) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)*local_d0;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(*local_d0 + mask_stride);
      auVar19 = paddusb(auVar19,auVar14);
      auVar20[0] = pavgb(auVar19[0],0);
      auVar20[1] = pavgb(auVar19[1],0);
      auVar20[2] = pavgb(auVar19[2],0);
      auVar20[3] = pavgb(auVar19[3],0);
      auVar20[4] = pavgb(auVar19[4],0);
      auVar20[5] = pavgb(auVar19[5],0);
      auVar20[6] = pavgb(auVar19[6],0);
      auVar20[7] = pavgb(auVar19[7],0);
      auVar20[8] = pavgb(auVar19[8],0);
      auVar20[9] = pavgb(auVar19[9],0);
      auVar20[10] = pavgb(auVar19[10],0);
      auVar20[0xb] = pavgb(auVar19[0xb],0);
      auVar20[0xc] = pavgb(auVar19[0xc],0);
      auVar20[0xd] = pavgb(auVar19[0xd],0);
      auVar20[0xe] = pavgb(auVar19[0xe],0);
      auVar20[0xf] = pavgb(auVar19[0xf],0);
      m0 = (__m128i)pmovzxbw(auVar14,auVar20);
      blend_a64_d16_mask_w8_sse41(local_c8,src0,src1,&m0,&v_round_offset,&v_maxval,shift);
      local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride * 2);
      local_c8 = local_c8 + dst_stride;
      src1 = src1 + src1_stride;
      src0 = src0 + uVar4;
      iVar6 = iVar6 + -1;
    }
  }
  else if (w == 4) {
    iVar6 = 0;
    if (0 < h) {
      iVar6 = h;
    }
    auVar14 = pmovsxbw(in_XMM2,0x4040404040404040);
    auVar19 = ZEXT416(shift);
    while (bVar12 = iVar6 != 0, iVar6 = iVar6 + -1, bVar12) {
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)*local_d0;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)(*local_d0 + mask_stride);
      auVar20 = paddusb(auVar39,auVar25);
      auVar40[0] = pavgb(auVar20[0],0);
      auVar40[1] = pavgb(auVar20[1],0);
      auVar40[2] = pavgb(auVar20[2],0);
      auVar40[3] = pavgb(auVar20[3],0);
      auVar40[4] = pavgb(auVar20[4],0);
      auVar40[5] = pavgb(auVar20[5],0);
      auVar40[6] = pavgb(auVar20[6],0);
      auVar40[7] = pavgb(auVar20[7],0);
      auVar40[8] = pavgb(auVar20[8],0);
      auVar40[9] = pavgb(auVar20[9],0);
      auVar40[10] = pavgb(auVar20[10],0);
      auVar40[0xb] = pavgb(auVar20[0xb],0);
      auVar40[0xc] = pavgb(auVar20[0xc],0);
      auVar40[0xd] = pavgb(auVar20[0xd],0);
      auVar40[0xe] = pavgb(auVar20[0xe],0);
      auVar40[0xf] = pavgb(auVar20[0xf],0);
      auVar20 = pmovzxbw(auVar25,auVar40);
      auVar26._0_2_ = auVar20._0_2_;
      uVar1 = *(ulong *)src0;
      uVar2 = *(undefined8 *)src1;
      auVar51._8_4_ = 0;
      auVar51._0_8_ = uVar1;
      auVar51._12_2_ = (short)(uVar1 >> 0x30);
      auVar51._14_2_ = (short)((ulong)uVar2 >> 0x30);
      auVar50._12_4_ = auVar51._12_4_;
      auVar50._8_2_ = 0;
      auVar50._0_8_ = uVar1;
      auVar50._10_2_ = (short)((ulong)uVar2 >> 0x20);
      auVar49._10_6_ = auVar50._10_6_;
      auVar49._8_2_ = (short)(uVar1 >> 0x20);
      auVar49._0_8_ = uVar1;
      auVar48._8_8_ = auVar49._8_8_;
      auVar48._6_2_ = (short)((ulong)uVar2 >> 0x10);
      auVar48._4_2_ = (short)(uVar1 >> 0x10);
      auVar48._0_2_ = (undefined2)uVar1;
      auVar48._2_2_ = (short)uVar2;
      auVar29._0_12_ = auVar20._0_12_;
      auVar29._12_2_ = auVar20._6_2_;
      auVar29._14_2_ = auVar14._6_2_ - auVar20._6_2_;
      auVar28._12_4_ = auVar29._12_4_;
      auVar28._0_10_ = auVar20._0_10_;
      auVar28._10_2_ = auVar14._4_2_ - auVar20._4_2_;
      auVar27._10_6_ = auVar28._10_6_;
      auVar27._0_8_ = auVar20._0_8_;
      auVar27._8_2_ = auVar20._4_2_;
      auVar26._8_8_ = auVar27._8_8_;
      auVar26._6_2_ = auVar14._2_2_ - auVar20._2_2_;
      auVar26._4_2_ = auVar20._2_2_;
      auVar26._2_2_ = auVar14._0_2_ - auVar26._0_2_;
      auVar20 = pmaddwd(auVar26,auVar48);
      auVar30._0_4_ = auVar20._0_4_ + iVar8 * -0x40 >> auVar19;
      auVar30._4_4_ = auVar20._4_4_ + iVar8 * -0x40 >> auVar19;
      auVar30._8_4_ = auVar20._8_4_ + iVar8 * -0x40 >> auVar19;
      auVar30._12_4_ = auVar20._12_4_ + iVar8 * -0x40 >> auVar19;
      auVar20 = packssdw(auVar30,auVar30);
      sVar41 = auVar20._0_2_;
      sVar42 = auVar20._2_2_;
      sVar43 = auVar20._4_2_;
      sVar3 = auVar20._6_2_;
      *(uint *)local_c8 =
           CONCAT13((0 < sVar3) * (sVar3 < 0x100) * auVar20[6] - (0xff < sVar3),
                    CONCAT12((0 < sVar43) * (sVar43 < 0x100) * auVar20[4] - (0xff < sVar43),
                             CONCAT11((0 < sVar42) * (sVar42 < 0x100) * auVar20[2] - (0xff < sVar42)
                                      ,(0 < sVar41) * (sVar41 < 0x100) * auVar20[0] -
                                       (0xff < sVar41))));
      local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride * 2);
      local_c8 = local_c8 + dst_stride;
      src1 = src1 + src1_stride;
      src0 = (CONV_BUF_TYPE *)((long)src0 + uVar4 * 2);
    }
  }
  else {
    v_maxval = (__m128i)pmovsxbw((undefined1  [16])v_round_offset,0x4040404040404040);
    iVar6 = 0;
    if (h < 1) {
      h = 0;
    }
    puVar9 = mask + mask_stride;
    for (; iVar6 != h; iVar6 = iVar6 + 1) {
      pCVar7 = src0;
      pCVar10 = src1;
      for (lVar11 = 0; lVar11 < w; lVar11 = lVar11 + 0x10) {
        auVar14 = paddusb(*(undefined1 (*) [16])(puVar9 + lVar11),
                          *(undefined1 (*) [16])(*local_d0 + lVar11));
        auVar18[0] = pavgb(auVar14[0],0);
        auVar18[1] = pavgb(auVar14[1],0);
        auVar18[2] = pavgb(auVar14[2],0);
        auVar18[3] = pavgb(auVar14[3],0);
        auVar18[4] = pavgb(auVar14[4],0);
        auVar18[5] = pavgb(auVar14[5],0);
        auVar18[6] = pavgb(auVar14[6],0);
        auVar18[7] = pavgb(auVar14[7],0);
        auVar18[8] = pavgb(auVar14[8],0);
        auVar18[9] = pavgb(auVar14[9],0);
        auVar18[10] = pavgb(auVar14[10],0);
        auVar18[0xb] = pavgb(auVar14[0xb],0);
        auVar18[0xc] = pavgb(auVar14[0xc],0);
        auVar18[0xd] = pavgb(auVar14[0xd],0);
        auVar18[0xe] = pavgb(auVar14[0xe],0);
        auVar18[0xf] = pavgb(auVar14[0xf],0);
        m0 = (__m128i)pmovzxbw(*(undefined1 (*) [16])(*local_d0 + lVar11),auVar18);
        uVar15 = CONCAT12(auVar18[9],(ushort)auVar18[8]);
        uVar16 = CONCAT14(auVar18[10],(uint)uVar15);
        uVar17 = CONCAT16(auVar18[0xb],(uint6)uVar16);
        _local_48 = (ulong)uVar17;
        uStack_40._0_1_ = auVar18[0xc];
        uStack_40._1_1_ = 0;
        uStack_3e._0_1_ = auVar18[0xd];
        uStack_3e._1_1_ = 0;
        uStack_3c._0_1_ = auVar18[0xe];
        uStack_3c._1_1_ = 0;
        uStack_3a._0_1_ = auVar18[0xf];
        uStack_3a._1_1_ = 0;
        blend_a64_d16_mask_w16_sse41
                  (local_c8 + lVar11,pCVar7,pCVar10,&m0,(__m128i *)local_48,&v_round_offset,
                   &v_maxval,shift);
        pCVar10 = pCVar10 + 0x10;
        pCVar7 = pCVar7 + 0x10;
      }
      local_d0 = (undefined1 (*) [16])(*local_d0 + mask_stride * 2);
      local_c8 = local_c8 + dst_stride;
      src1 = src1 + src1_stride;
      src0 = src0 + uVar4;
      puVar9 = puVar9 + mask_stride * 2;
    }
  }
  return;
}

Assistant:

void aom_lowbd_blend_a64_d16_mask_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params) {
  const int bd = 8;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  const int round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;

  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;
  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  const __m128i v_round_offset = _mm_set1_epi32(round_offset);

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }

  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }
  } else if (subw == 1 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh0_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }
  } else {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh1_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }
  }
}